

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

void __thiscall Ptex::v2_2::PtexReader::prune(PtexReader *this)

{
  Level *this_00;
  pointer ppLVar1;
  
  if (this->_metadata != (MetaData *)0x0) {
    (*(this->_metadata->super_PtexMetaData)._vptr_PtexMetaData[1])();
    this->_metadata = (MetaData *)0x0;
  }
  for (ppLVar1 = (this->_levels).
                 super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar1 !=
      (this->_levels).
      super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppLVar1 = ppLVar1 + 1) {
    this_00 = *ppLVar1;
    if (this_00 != (Level *)0x0) {
      Level::~Level(this_00);
      operator_delete(this_00,0x48);
      *ppLVar1 = (Level *)0x0;
    }
  }
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
  deleteContents(&this->_reductions);
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
  initContents(&this->_reductions);
  this->_memUsed = this->_baseMemUsed;
  return;
}

Assistant:

void PtexReader::prune()
{
    if (_metadata) { delete _metadata; _metadata = 0; }
    for (std::vector<Level*>::iterator i = _levels.begin(); i != _levels.end(); ++i) {
        if (*i) { delete *i; *i = 0; }
    }
    _reductions.clear();
    _memUsed = _baseMemUsed;
}